

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_lzop.c
# Opt level: O0

int archive_write_lzop_open(archive_write_filter *f)

{
  int iVar1;
  undefined1 auStack_30 [4];
  int r;
  archive_string as;
  write_lzop *data;
  archive_write_filter *f_local;
  
  as.buffer_length = (size_t)f->data;
  _auStack_30 = (char *)0x0;
  as.length = 0;
  as.s = (char *)0x0;
  archive_strncat((archive_string *)auStack_30,"lzop",4);
  if (0 < *(int *)as.buffer_length) {
    archive_strappend_char((archive_string *)auStack_30,' ');
    archive_strappend_char((archive_string *)auStack_30,'-');
    archive_strappend_char((archive_string *)auStack_30,(char)*(undefined4 *)as.buffer_length + '0')
    ;
  }
  iVar1 = __archive_write_program_open
                    (f,*(archive_write_program_data **)(as.buffer_length + 8),_auStack_30);
  archive_string_free((archive_string *)auStack_30);
  return iVar1;
}

Assistant:

static int
archive_write_lzop_open(struct archive_write_filter *f)
{
	struct write_lzop *data = (struct write_lzop *)f->data;
	struct archive_string as;
	int r;

	archive_string_init(&as);
	archive_strcpy(&as, "lzop");
	/* Specify compression level. */
	if (data->compression_level > 0) {
		archive_strappend_char(&as, ' ');
		archive_strappend_char(&as, '-');
		archive_strappend_char(&as, '0' + data->compression_level);
	}

	r = __archive_write_program_open(f, data->pdata, as.s);
	archive_string_free(&as);
	return (r);
}